

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiFAQ.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar4;
  typed_value<bool,_char> *ptVar5;
  typed_value<unsigned_long,_char> *ptVar6;
  size_type sVar7;
  ostream *poVar8;
  string *psVar9;
  duration __val;
  rep rVar10;
  variables_map *in_stack_00000008;
  Launcher *in_stack_00000010;
  int64_t end;
  int result;
  int64_t start;
  shared_ptr<Launcher> launcher;
  string outputDirectory;
  string codeGenerator;
  path pathToFiles;
  path pathToData;
  variables_map vm;
  options_description desc;
  Launcher *in_stack_fffffffffffff5e8;
  Launcher *in_stack_fffffffffffff5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff5f8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  *in_stack_fffffffffffff600;
  char *in_stack_fffffffffffff610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff618;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *in_stack_fffffffffffff620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff630;
  char *in_stack_fffffffffffff638;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *in_stack_fffffffffffff6c8;
  undefined8 in_stack_fffffffffffff6d0;
  undefined7 in_stack_fffffffffffff6d8;
  undefined1 in_stack_fffffffffffff6df;
  char **in_stack_fffffffffffff6e0;
  undefined8 in_stack_fffffffffffff6e8;
  int argc_00;
  string local_6e8 [32];
  string local_6c8 [32];
  string local_6a8 [32];
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_688;
  rep local_680;
  duration<long,_std::ratio<1L,_1000L>_> local_678;
  long local_670;
  int local_664;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_660;
  rep local_658;
  duration<long,_std::ratio<1L,_1000L>_> local_650;
  rep local_648;
  path local_630 [2];
  string local_5f0 [32];
  string local_5d0 [39];
  allocator local_5a9;
  string local_5a8 [64];
  path local_568;
  string local_548 [39];
  allocator local_521;
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0 [39];
  allocator local_499;
  string local_498 [71];
  allocator local_451;
  string local_450 [103];
  allocator local_3e9;
  string local_3e8 [32];
  path local_3c8 [2];
  allocator local_381;
  string local_380 [103];
  allocator local_319;
  string local_318 [32];
  path local_2f8;
  allocator local_2d1;
  string local_2d0 [32];
  undefined4 local_2b0;
  allocator local_2a9;
  string local_2a8 [32];
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  basic_parsed_options local_268 [40];
  variables_map local_240 [160];
  undefined8 local_1a0;
  undefined1 local_193;
  undefined1 local_192;
  allocator local_191;
  string local_190 [39];
  allocator local_169;
  string local_168 [39];
  allocator local_141;
  string local_140 [39];
  allocator local_119;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [32];
  undefined8 local_d0 [3];
  allocator local_b1;
  string local_b0 [32];
  options_description local_90 [140];
  int local_4;
  
  argc_00 = (int)((ulong)in_stack_fffffffffffff6e8 >> 0x20);
  iVar2 = (int)((ulong)in_stack_fffffffffffff6d0 >> 0x20);
  local_4 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"multiFAQ - allowed options",&local_b1);
  boost::program_options::options_description::options_description
            (local_90,local_b0,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  local_d0[0] = boost::program_options::options_description::add_options();
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_d0,"help,h");
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()(pcVar3,"info");
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"path,p",(char *)ptVar4);
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"files,f",(char *)ptVar4);
  boost::program_options::value<std::__cxx11::string>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"features.conf",&local_f1);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"feat",(char *)ptVar4);
  boost::program_options::value<std::__cxx11::string>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"treedecomposition.conf",&local_119);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"td",(char *)ptVar4);
  boost::program_options::value<std::__cxx11::string>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"schema.conf",&local_141);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"schema",(char *)ptVar4);
  boost::program_options::value<std::__cxx11::string>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"covar",&local_169);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"model,m",(char *)ptVar4);
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"out,o",(char *)ptVar4);
  boost::program_options::value<std::__cxx11::string>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"both",&local_191);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"parallel",(char *)ptVar4);
  boost::program_options::value<bool>();
  local_192 = 1;
  ptVar5 = boost::program_options::typed_value<bool,_char>::default_value
                     ((typed_value<bool,_char> *)in_stack_fffffffffffff620,
                      (bool *)in_stack_fffffffffffff618);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"mo",(char *)ptVar5);
  boost::program_options::value<bool>();
  local_193 = 1;
  ptVar5 = boost::program_options::typed_value<bool,_char>::default_value
                     ((typed_value<bool,_char> *)in_stack_fffffffffffff620,
                      (bool *)in_stack_fffffffffffff618);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"compress",(char *)ptVar5);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,"microbench");
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,"bench_individual");
  boost::program_options::value<unsigned_long>();
  local_1a0 = 5;
  ptVar6 = boost::program_options::typed_value<unsigned_long,_char>::default_value
                     ((typed_value<unsigned_long,_char> *)in_stack_fffffffffffff620,
                      (unsigned_long *)in_stack_fffffffffffff618);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"clusters,k",(char *)ptVar6);
  ptVar6 = boost::program_options::value<unsigned_long>();
  boost::program_options::options_description_easy_init::operator()
            (pcVar3,(value_semantic *)"kappa",(char *)ptVar6);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  boost::program_options::variables_map::variables_map(local_240);
  local_278 = 0;
  uStack_270 = 0;
  local_288 = 0;
  uStack_280 = 0;
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *)0x1ced17);
  boost::program_options::parse_command_line<char>
            (argc_00,in_stack_fffffffffffff6e0,
             (options_description *)CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
             iVar2,in_stack_fffffffffffff6c8);
  boost::program_options::store(local_268,local_240,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options
            ((basic_parsed_options<char> *)0x1ced70);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)0x1ced7d);
  boost::program_options::notify(local_240);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a8,"help",&local_2a9);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(in_stack_fffffffffffff600,in_stack_fffffffffffff5f8);
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  if (sVar7 != 0) {
    poVar8 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,local_90);
    std::operator<<(poVar8,"\n");
    local_4 = 0;
    local_2b0 = 1;
    goto LAB_001d0378;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d0,"info",&local_2d1);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(in_stack_fffffffffffff600,in_stack_fffffffffffff5f8);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  if (sVar7 != 0) {
    std::operator<<((ostream *)&std::cout,"LMFAO - 0.1 Edition\n");
    poVar8 = std::operator<<((ostream *)&std::cout,"Compiled on ");
    poVar8 = std::operator<<(poVar8,"Apr 26 2025");
    poVar8 = std::operator<<(poVar8," at ");
    poVar8 = std::operator<<(poVar8,"18:37:31");
    std::operator<<(poVar8,".\n");
    std::operator<<((ostream *)&std::cout,"Build type: Benchmark.\n");
    local_4 = 0;
    local_2b0 = 1;
    goto LAB_001d0378;
  }
  boost::filesystem::path::path((path *)0x1cf29f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_318,"path",&local_319);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(in_stack_fffffffffffff600,in_stack_fffffffffffff5f8);
  std::__cxx11::string::~string(local_318);
  std::allocator<char>::~allocator((allocator<char> *)&local_319);
  if (sVar7 == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,
                             "You must specify a path containing the database and configuration files.\n"
                            );
    std::operator<<(poVar8,
                    "Run program with --help for more information about command line options.\n");
    local_4 = 1;
    local_2b0 = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_380,"path",&local_381);
    boost::program_options::variables_map::operator[]
              ((variables_map *)in_stack_fffffffffffff5f0,(string *)in_stack_fffffffffffff5e8);
    boost::program_options::variable_value::as<std::__cxx11::string>((variable_value *)0x1cf38c);
    boost::filesystem::path::path
              ((path *)in_stack_fffffffffffff5f0,(string_type *)in_stack_fffffffffffff5e8);
    boost::filesystem::current_path();
    boost::filesystem::canonical
              ((path *)in_stack_fffffffffffff5f8,(path *)in_stack_fffffffffffff5f0);
    boost::filesystem::path::operator=
              ((path *)in_stack_fffffffffffff5f0,(path *)in_stack_fffffffffffff5e8);
    boost::filesystem::path::~path((path *)0x1cf40d);
    boost::filesystem::path::~path((path *)0x1cf41a);
    boost::filesystem::path::~path((path *)0x1cf427);
    std::__cxx11::string::~string(local_380);
    std::allocator<char>::~allocator((allocator<char> *)&local_381);
    bVar1 = boost::filesystem::is_directory((path *)in_stack_fffffffffffff5f0);
    if (bVar1) {
      boost::filesystem::path::path((path *)0x1cf5e6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3e8,"files",&local_3e9);
      sVar7 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::count(in_stack_fffffffffffff600,in_stack_fffffffffffff5f8);
      std::__cxx11::string::~string(local_3e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
      if (sVar7 == 0) {
        boost::filesystem::path::operator=
                  ((path *)in_stack_fffffffffffff5f0,(path *)in_stack_fffffffffffff5e8);
LAB_001cf8eb:
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_498,"cpp",&local_499);
        std::allocator<char>::~allocator((allocator<char> *)&local_499);
        iVar2 = std::__cxx11::string::compare((char *)local_498);
        if ((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)local_498), iVar2 == 0))
        {
          std::__cxx11::string::string(local_500);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_520,"out",&local_521);
          sVar7 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                  ::count(in_stack_fffffffffffff600,in_stack_fffffffffffff5f8);
          std::__cxx11::string::~string(local_520);
          std::allocator<char>::~allocator((allocator<char> *)&local_521);
          if (sVar7 == 0) {
            std::operator+(in_stack_fffffffffffff638,in_stack_fffffffffffff630);
            std::operator+(in_stack_fffffffffffff5f8,(char *)in_stack_fffffffffffff5f0);
            std::__cxx11::string::operator=(local_500,local_5d0);
            std::__cxx11::string::~string(local_5d0);
            std::__cxx11::string::~string(local_5f0);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_5a8,"out",&local_5a9);
            boost::program_options::variables_map::operator[]
                      ((variables_map *)in_stack_fffffffffffff5f0,
                       (string *)in_stack_fffffffffffff5e8);
            boost::program_options::variable_value::as<std::__cxx11::string>
                      ((variable_value *)0x1cfb6e);
            boost::filesystem::path::path
                      ((path *)in_stack_fffffffffffff5f0,(string_type *)in_stack_fffffffffffff5e8);
            boost::filesystem::weakly_canonical((path *)in_stack_fffffffffffff5e8);
            boost::filesystem::path::string_abi_cxx11_(&local_568);
            std::operator+(in_stack_fffffffffffff618,in_stack_fffffffffffff610);
            std::__cxx11::string::operator=(local_500,local_548);
            std::__cxx11::string::~string(local_548);
            boost::filesystem::path::~path((path *)0x1cfc0a);
            boost::filesystem::path::~path((path *)0x1cfc17);
            std::__cxx11::string::~string(local_5a8);
            std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
          }
          boost::filesystem::path::path
                    ((path *)in_stack_fffffffffffff5f0,(string_type *)in_stack_fffffffffffff5e8);
          boost::filesystem::create_directories((path *)0x1cfdde);
          boost::filesystem::path::~path((path *)0x1cfdf4);
          psVar9 = boost::filesystem::path::string_abi_cxx11_(&local_2f8);
          std::__cxx11::string::operator=
                    ((string *)multifaq::dir::PATH_TO_DATA_abi_cxx11_,(string *)psVar9);
          boost::filesystem::path::filename();
          psVar9 = boost::filesystem::path::string_abi_cxx11_(local_630);
          std::__cxx11::string::operator=
                    ((string *)multifaq::dir::DATASET_NAME_abi_cxx11_,(string *)psVar9);
          boost::filesystem::path::~path((path *)0x1cfea9);
          psVar9 = boost::filesystem::path::string_abi_cxx11_(local_3c8);
          std::__cxx11::string::operator=
                    ((string *)multifaq::dir::PATH_TO_FILES_abi_cxx11_,(string *)psVar9);
          std::__cxx11::string::operator=
                    ((string *)multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,local_500);
          operator_new(0x90);
          Launcher::Launcher(in_stack_fffffffffffff5f0);
          std::shared_ptr<Launcher>::shared_ptr<Launcher,void>
                    ((shared_ptr<Launcher> *)in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8);
          local_660.__d.__r = (duration)std::chrono::_V2::system_clock::now();
          local_658 = (rep)std::chrono::
                           time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                           ::time_since_epoch(&local_660);
          local_650.__r =
               (rep)std::chrono::
                    duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                              ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                               in_stack_fffffffffffff5e8);
          local_648 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_650);
          std::__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x1cff9a);
          local_664 = Launcher::launch(in_stack_00000010,in_stack_00000008);
          local_688.__d.__r = (duration)std::chrono::_V2::system_clock::now();
          __val = std::chrono::
                  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  ::time_since_epoch(&local_688);
          local_680 = __val.__r;
          local_678.__r =
               (rep)std::chrono::
                    duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                              ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                               in_stack_fffffffffffff5e8);
          rVar10 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_678);
          local_670 = rVar10 - local_648;
          std::__cxx11::to_string(__val.__r);
          std::operator+((char *)in_stack_fffffffffffff5f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff5f0);
          std::operator+(in_stack_fffffffffffff5f8,(char *)in_stack_fffffffffffff5f0);
          std::operator<<((ostream *)&std::cout,local_6a8);
          std::__cxx11::string::~string(local_6a8);
          std::__cxx11::string::~string(local_6c8);
          std::__cxx11::string::~string(local_6e8);
          poVar8 = std::operator<<((ostream *)&std::cout,"----------------------------------------")
          ;
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          poVar8 = std::operator<<((ostream *)&std::cout,"The generated code was output to: ");
          poVar8 = std::operator<<(poVar8,local_500);
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          poVar8 = std::operator<<((ostream *)&std::cout,
                                   "Run the following commands to execute code: ");
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          poVar8 = std::operator<<((ostream *)&std::cout,"   cd ");
          poVar8 = std::operator<<(poVar8,local_500);
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          in_stack_fffffffffffff5f0 =
               (Launcher *)std::operator<<((ostream *)&std::cout,"   make -j ");
          std::ostream::operator<<
                    ((ostream *)in_stack_fffffffffffff5f0,std::endl<char,std::char_traits<char>>);
          poVar8 = std::operator<<((ostream *)&std::cout,"   ./lmfao ");
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          local_4 = local_664;
          local_2b0 = 1;
          std::shared_ptr<Launcher>::~shared_ptr((shared_ptr<Launcher> *)0x1d022a);
          std::__cxx11::string::~string(local_500);
        }
        else {
          std::operator+(in_stack_fffffffffffff638,in_stack_fffffffffffff630);
          std::operator+(in_stack_fffffffffffff5f8,(char *)in_stack_fffffffffffff5f0);
          std::operator<<((ostream *)&std::cerr,local_4c0);
          std::__cxx11::string::~string(local_4c0);
          std::__cxx11::string::~string(local_4e0);
          local_4 = 1;
          local_2b0 = 1;
        }
        std::__cxx11::string::~string(local_498);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_450,"files",&local_451);
        boost::program_options::variables_map::operator[]
                  ((variables_map *)in_stack_fffffffffffff5f0,(string *)in_stack_fffffffffffff5e8);
        boost::program_options::variable_value::as<std::__cxx11::string>((variable_value *)0x1cf6d3)
        ;
        boost::filesystem::path::path
                  ((path *)in_stack_fffffffffffff5f0,(string_type *)in_stack_fffffffffffff5e8);
        boost::filesystem::current_path();
        boost::filesystem::canonical
                  ((path *)in_stack_fffffffffffff5f8,(path *)in_stack_fffffffffffff5f0);
        boost::filesystem::path::operator=
                  ((path *)in_stack_fffffffffffff5f0,(path *)in_stack_fffffffffffff5e8);
        boost::filesystem::path::~path((path *)0x1cf754);
        boost::filesystem::path::~path((path *)0x1cf761);
        boost::filesystem::path::~path((path *)0x1cf76e);
        std::__cxx11::string::~string(local_450);
        std::allocator<char>::~allocator((allocator<char> *)&local_451);
        bVar1 = boost::filesystem::is_directory((path *)in_stack_fffffffffffff5f0);
        if (bVar1) goto LAB_001cf8eb;
        std::operator<<((ostream *)&std::cerr,"Provided path to files is not a directory. \n");
        local_4 = 1;
        local_2b0 = 1;
      }
      boost::filesystem::path::~path((path *)0x1d0349);
    }
    else {
      std::operator<<((ostream *)&std::cerr,"Provided path is not a directory. \n");
      local_4 = 1;
      local_2b0 = 1;
    }
  }
  boost::filesystem::path::~path((path *)0x1d0367);
LAB_001d0378:
  boost::program_options::variables_map::~variables_map((variables_map *)in_stack_fffffffffffff5f0);
  boost::program_options::options_description::~options_description
            ((options_description *)in_stack_fffffffffffff5f0);
  return local_4;
}

Assistant:

int main(int argc, char *argv[])
{
   /* Object containing a description of all the options available in the
      program. */
   boost::program_options::options_description desc("multiFAQ - allowed options");
   desc.add_options()
       /* Option to show help. */
       ("help,h", "produce help message.")
       /* Option to show some info. */
       ("info", "show some information about the program.")
       /* Option for path to data and configuration files. */
       ("path,p", boost::program_options::value<std::string>(),
        "set path for data and configuration files - required.")
       /* Option for path to data and configuration files. */
       ("files,f", boost::program_options::value<std::string>(),
        "set path for config files - if different from path to data.")     
       /* Option for feature config file. */
       ("feat", boost::program_options::value<std::string>()->
        default_value("features.conf"),
        "features file for this model, assumed to be in pathToFiles")
       /* Option for treedecomposition config file. */
       ("td", boost::program_options::value<std::string>()->
        default_value("treedecomposition.conf"),
        "tree decomposition config file, assumed to be in pathToFiles")
       /* Option for treedecomposition config file. */
       ("schema", boost::program_options::value<std::string>()->
        default_value("schema.conf"),
        "schmea config file, assumed to be in pathToFiles")
       /* Option for machine learning model. */
       ("model,m", boost::program_options::value<std::string>()->default_value("covar"),
        "model to be computed: reg, covar (default), ctree, rtree, cube, mi, or perc")
       /* Option for code generator. */
       // ("codegen,g", boost::program_options::value<std::string>()->default_value("cpp"),
       //  "open for code generation: cpp (default), or sql")
       /* Option for directory of generated code. */
       ("out,o",boost::program_options::value<std::string>(),
        "output directory for the generated code, default: runtime/cpp/")
       /* Option for parallellization. */
       ("parallel", boost::program_options::value<std::string>()->default_value("both"),
        "options for parallelization: none, task, domain, or both (default)")
       /* Option to turn off mutlti output operator. */
       ("mo", boost::program_options::value<bool>()->default_value("1"),
        "turn multioutput operator on (default)/off")
       /* Option to turn off compression of aggregates operator. */
       ("compress", boost::program_options::value<bool>()->default_value("1"),
        "turn compression of aggregates on (default)/off")
       /* Option to turn off mutlti output operator. */
       // ("resort", "enables resorting of views / relations, requires multiout off.")
       /* Option to turn off mutlti output operator. */
       ("microbench", "enables micro benchmarking.")
       /* Option to turn off mutlti output operator. */
       ("bench_individual", "enables benchmarking for each group individually.")
       ("clusters,k", boost::program_options::value<size_t>()->default_value(5),
        "k for k-means algorithm. (Default = 5).")
       ("kappa", boost::program_options::value<size_t>(),
        "kappa for k-means algorithm. (Default = k).");
       /* Option for parallellization. */
       // ("degree", boost::program_options::value<int>()->default_value(1),
       //  "Degree of interactions for regression models and FMs. (Default = 1).");


   /* Register previous options and do command line parsing. */
   boost::program_options::variables_map vm;
   boost::program_options::store(
       boost::program_options::parse_command_line(argc, argv, desc), vm);
   boost::program_options::notify(vm);

   /* Display help. */
   if (vm.count("help"))
   {
      std::cout << desc << "\n";
      return EXIT_SUCCESS;
   }

   /* Display info. */
   if (vm.count("info"))
   {
      std::cout << "LMFAO - 0.1 Edition\n";
      std::cout << "Compiled on " << __DATE__ << " at " << __TIME__ << ".\n";
#ifdef BENCH
      std::cout << "Build type: Benchmark.\n";
#elif defined NDEBUG
      std::cout << "Build type: Release.\n";
#else
      std::cout << "Build type: Debug.\n";
#endif
      return EXIT_SUCCESS;
   }

   
   boost::filesystem::path pathToData;
   
   /* Retrieve compulsory path. */
   if (vm.count("path"))
   {
       
       pathToData = boost::filesystem::canonical(vm["path"].as<std::string>());

       /*If provided path is not a directory, return failure. */
       if (!boost::filesystem::is_directory(pathToData))
       {
           ERROR("Provided path is not a directory. \n");
           return EXIT_FAILURE;
       }
   }
   else
   {
      ERROR(
         "You must specify a path containing the database and configuration files.\n" <<
         "Run program with --help for more information about command line options.\n");
      return EXIT_FAILURE;
   }   

   boost::filesystem::path pathToFiles;

   /* Retrieve path to files. */
   if (vm.count("files"))
   {
       pathToFiles = boost::filesystem::canonical(vm["files"].as<std::string>());

       /*If provided path is not a directory, return failure. */
       if (!boost::filesystem::is_directory(pathToFiles))
       {
           ERROR("Provided path to files is not a directory. \n");
           return EXIT_FAILURE;
       }
   }
   else
   {
       pathToFiles = pathToData;
   }   

   /* Check the code generator is supported */
   std::string codeGenerator =  "cpp"; // vm["codegen"].as<std::string>();

   if (codeGenerator.compare("cpp") != 0 && codeGenerator.compare("sql") != 0)
   {
       ERROR("The code generator "+codeGenerator+" is not supported. \n");
       return EXIT_FAILURE;
   }


   /* Set the path for outDirectory */
   std::string outputDirectory;
   if (vm.count("out"))
       outputDirectory = boost::filesystem::weakly_canonical(
           vm["out"].as<std::string>()).string()+"/";
   else
       outputDirectory = "runtime/"+codeGenerator+"/";
   
   /*If provided path is not a directory, create it. */
   if (boost::filesystem::create_directories(outputDirectory))
   {   
       DINFO("INFO: Output directory " << outputDirectory << " created." << std::endl);
   }
   else
   {    
       DINFO("INFO: Output directory " << outputDirectory << " exists." << std::endl);
   }
   
           
   /* Setting global parameters for directories */
   multifaq::dir::PATH_TO_DATA = pathToData.string();
   multifaq::dir::DATASET_NAME = pathToData.filename().string();
   multifaq::dir::PATH_TO_FILES = pathToFiles.string();
   multifaq::dir::OUTPUT_DIRECTORY = outputDirectory;


   /* Create and run Launcher */
   std::shared_ptr<Launcher> launcher(new Launcher());

#ifdef BENCH
   int64_t start = std::chrono::duration_cast<std::chrono::milliseconds>(
       std::chrono::system_clock::now().time_since_epoch()).count();
#endif

   /* Launch program. */
   int result = launcher->launch(vm);

#ifdef BENCH
   int64_t end = std::chrono::duration_cast<std::chrono::milliseconds>(
       std::chrono::system_clock::now().time_since_epoch()).count() - start;
#endif

   BINFO("BENCH - overall compilation time: " + std::to_string(end) + "ms.\n");
   DINFO("INFO: Completed execution \n");
   
   std::cout << "----------------------------------------" << std::endl;
   std::cout << "The generated code was output to: " << outputDirectory << std::endl;
   std::cout << "Run the following commands to execute code: "  << std::endl;
   std::cout << "   cd " << outputDirectory << std::endl;
   std::cout << "   make -j " << std::endl;
   std::cout << "   ./lmfao " << std::endl;
   
   return result;
}